

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

String * kj::_::CopyConstructArray_<kj::String,_kj::String_*,_true,_false>::apply
                   (String *pos,String *start,String *end)

{
  for (; start != end; start = start + 1) {
    (pos->content).ptr = (start->content).ptr;
    (pos->content).size_ = (start->content).size_;
    (pos->content).disposer = (start->content).disposer;
    pos = pos + 1;
    (start->content).ptr = (char *)0x0;
    (start->content).size_ = 0;
  }
  return pos;
}

Assistant:

static T* apply(T* __restrict__ pos, Iterator start, Iterator end) {
    // Verify that T can be *implicitly* constructed from the source values.
    if (false) implicitCast<T>(kj::mv(*start));

    if (noexcept(T(kj::mv(*start)))) {
      while (start != end) {
        ctor(*pos++, kj::mv(*start++));
      }
      return pos;
    } else {
      // Crap.  This is complicated.
      ExceptionGuard guard(pos);
      while (start != end) {
        ctor(*guard.pos, kj::mv(*start++));
        ++guard.pos;
      }
      guard.start = guard.pos;
      return guard.pos;
    }
  }